

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkroom.c
# Opt level: O3

mkroom * pick_room(level *lev,boolean strict)

{
  mkroom *pmVar1;
  char cVar2;
  uint uVar3;
  mkroom *pmVar4;
  ulong uVar5;
  mkroom *pmVar6;
  
  uVar5 = (ulong)lev->nroom;
  uVar3 = mt_random();
  if (uVar5 != 0) {
    pmVar1 = lev->rooms;
    pmVar4 = pmVar1 + SUB168(ZEXT416(uVar3) % SEXT816((long)uVar5),0);
    do {
      pmVar6 = pmVar1;
      if (pmVar4 != pmVar1 + lev->nroom) {
        pmVar6 = pmVar4;
      }
      if (pmVar6->hx < '\0') {
        return (mkroom *)0x0;
      }
      if (pmVar6->rtype == '\0') {
        if (strict == '\0') {
          if (lev->upstairs_room != pmVar6) {
            cVar2 = (lev->sstairs).sx;
            if (cVar2 == '\0') {
              pmVar4 = lev->dnstairs_room;
joined_r0x001e480c:
              if (pmVar4 == pmVar6) {
LAB_001e480e:
                uVar3 = mt_random();
                if (0x55555555 < uVar3 * -0x55555555) goto LAB_001e473b;
              }
              goto LAB_001e4824;
            }
            if (((lev->sstairs).up == '\0') || (lev->sstairs_room != pmVar6)) {
              if (lev->dnstairs_room != pmVar6) {
                if ((cVar2 == '\0') || ((lev->sstairs).up != '\0')) goto LAB_001e4824;
                pmVar4 = lev->sstairs_room;
                goto joined_r0x001e480c;
              }
              goto LAB_001e480e;
            }
          }
        }
        else if (lev->upstairs_room != pmVar6) {
          cVar2 = (lev->sstairs).sx;
          if (cVar2 == '\0') {
            pmVar4 = lev->dnstairs_room;
          }
          else {
            if ((((lev->sstairs).up != '\0') && (lev->sstairs_room == pmVar6)) ||
               (lev->dnstairs_room == pmVar6)) goto LAB_001e473b;
            if ((cVar2 == '\0') || ((lev->sstairs).up != '\0')) goto LAB_001e4824;
            pmVar4 = lev->sstairs_room;
          }
          if (pmVar4 != pmVar6) {
LAB_001e4824:
            if (pmVar6->doorct == '\x01') {
              return pmVar6;
            }
            uVar3 = mt_random();
            if (uVar3 * -0x33333333 < 0x33333334) {
              return pmVar6;
            }
            if (flags.debug != '\0') {
              return pmVar6;
            }
          }
        }
      }
LAB_001e473b:
      uVar3 = (int)uVar5 - 1;
      uVar5 = (ulong)uVar3;
      pmVar4 = pmVar6 + 1;
    } while (uVar3 != 0);
  }
  return (mkroom *)0x0;
}

Assistant:

struct mkroom *pick_room(struct level *lev, boolean strict)
{
	struct mkroom *sroom;
	int i = lev->nroom;

	for (sroom = &lev->rooms[rn2(lev->nroom)]; i--; sroom++) {
		if (sroom == &lev->rooms[lev->nroom])
			sroom = &lev->rooms[0];
		if (sroom->hx < 0)
			return NULL;
		if (sroom->rtype != OROOM)	continue;
		if (!strict) {
		    if (has_upstairs(lev, sroom) || (has_dnstairs(lev, sroom) && rn2(3)))
			continue;
		} else if (has_upstairs(lev, sroom) || has_dnstairs(lev, sroom))
			continue;
		if (sroom->doorct == 1 || !rn2(5) || wizard)
			return sroom;
	}
	return NULL;
}